

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,ExtPrivkey *ext_privkey,string *arg)

{
  ExtPubkey local_a0;
  
  this->key_type_ = kDescriptorKeyBip32Priv;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  ExtPrivkey::GetExtPubkey(&local_a0,ext_privkey);
  ExtPubkey::GetPubkey(&this->pubkey_,&local_a0);
  ExtPubkey::~ExtPubkey(&local_a0);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_,ext_privkey);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  KeyData::KeyData(&this->key_data_);
  if (arg == (string *)0x0) {
    ::std::__cxx11::string::string((string *)&this->argument_,"",(allocator *)&local_a0);
  }
  else {
    ::std::__cxx11::string::string((string *)&this->argument_,(string *)arg);
  }
  SchnorrPubkey::FromPubkey((SchnorrPubkey *)&local_a0,&this->pubkey_,(bool *)0x0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->schnorr_pubkey_,
             &local_a0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(
    const ExtPrivkey& ext_privkey, const std::string* arg)
    : key_type_(DescriptorKeyType::kDescriptorKeyBip32Priv),
      pubkey_(ext_privkey.GetExtPubkey().GetPubkey()),
      extprivkey_(ext_privkey),
      argument_((arg) ? *arg : "") {
  schnorr_pubkey_ = SchnorrPubkey::FromPubkey(pubkey_);
}